

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license.cpp
# Opt level: O1

void __thiscall
license::License::add_parameter(License *this,string *param_name,string *param_value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  License *pLVar3;
  string *__k;
  ostream oVar4;
  int iVar5;
  const_iterator cVar6;
  logic_error *plVar7;
  mapped_type *pmVar8;
  long lVar9;
  invalid_argument *piVar10;
  ostream *poVar11;
  long *plVar12;
  size_type *psVar13;
  bool bVar14;
  char cVar15;
  ulong uVar16;
  ostream *poVar17;
  undefined8 *puVar18;
  uint day;
  uint month;
  uint year;
  undefined1 local_204 [4];
  undefined1 local_200 [4];
  undefined1 local_1fc [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  License *local_1d8;
  string *local_1d0;
  undefined1 *local_1c8;
  undefined1 local_1b8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  cVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)NO_OUTPUT_PARAM_abi_cxx11_,param_name);
  if (cVar6.
      super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    lVar9 = std::__cxx11::string::find((char *)param_name,0x4291e0,0);
    if (((lVar9 == -1) &&
        (lVar9 = std::__cxx11::string::find((char *)param_name,0x429159,0), lVar9 == -1)) &&
       (lVar9 = std::__cxx11::string::find((char *)param_name,0x4298ea,0), lVar9 == -1)) {
      lVar9 = std::__cxx11::string::find((char *)param_name,0x455b78,0);
      if ((lVar9 == -1) || (iVar5 = std::__cxx11::string::compare((char *)param_value), iVar5 != 0))
      {
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->values_map,param_name);
        std::__cxx11::string::_M_assign((string *)pmVar8);
        return;
      }
    }
    else {
      local_1d8 = this;
      local_1d0 = param_name;
      if (param_value->_M_string_length < 8) {
        piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar10,"Date string too small for known formats");
        __cxa_throw(piVar10,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      puVar18 = &formats_abi_cxx11_;
      bVar14 = false;
      uVar16 = 0;
      while (iVar5 = __isoc99_sscanf((param_value->_M_dataplus)._M_p,*puVar18,local_1fc,local_200,
                                     local_204), iVar5 != 3) {
        if (1 < uVar16) goto LAB_00188b72;
        uVar16 = uVar16 + 1;
        puVar18 = puVar18 + 4;
      }
      bVar14 = true;
LAB_00188b72:
      if (!bVar14) {
        piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::operator+(&local_1f8,"Date [",param_value);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_1f8);
        local_1a8[0]._M_dataplus._M_p = (pointer)*plVar12;
        psVar13 = (size_type *)(plVar12 + 2);
        if ((size_type *)local_1a8[0]._M_dataplus._M_p == psVar13) {
          local_1a8[0].field_2._0_8_ = *psVar13;
          local_1a8[0].field_2._8_8_ = plVar12[3];
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        }
        else {
          local_1a8[0].field_2._0_8_ = *psVar13;
        }
        local_1a8[0]._M_string_length = plVar12[1];
        *plVar12 = (long)psVar13;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        std::invalid_argument::invalid_argument(piVar10,(string *)local_1a8);
        __cxa_throw(piVar10,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      __k = local_1d0;
      pLVar3 = local_1d8;
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"-",1);
      poVar17 = poVar11 + *(long *)(*(long *)poVar11 + -0x18);
      if (poVar11[*(long *)(*(long *)poVar11 + -0x18) + 0xe1] == (ostream)0x0) {
        oVar4 = (ostream)std::ios::widen((char)poVar17);
        poVar17[0xe0] = oVar4;
        poVar17[0xe1] = (ostream)0x1;
      }
      poVar17[0xe0] = (ostream)0x30;
      *(undefined8 *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x10) = 2;
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"-",1);
      poVar17 = poVar11 + *(long *)(*(long *)poVar11 + -0x18);
      if (poVar11[*(long *)(*(long *)poVar11 + -0x18) + 0xe1] == (ostream)0x0) {
        oVar4 = (ostream)std::ios::widen((char)poVar17);
        poVar17[0xe0] = oVar4;
        poVar17[0xe1] = (ostream)0x1;
      }
      poVar17[0xe0] = (ostream)0x30;
      *(undefined8 *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x10) = 2;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&pLVar3->values_map,__k);
      std::__cxx11::string::_M_assign((string *)pmVar8);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8);
      }
    }
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)param_name);
    if (iVar5 == 0) {
      std::__cxx11::string::_M_assign((string *)&this->m_feature_names);
      cVar15 = (char)&this->m_feature_names;
      lVar9 = std::__cxx11::string::find(cVar15,0x5b);
      if (((lVar9 != -1) || (lVar9 = std::__cxx11::string::find(cVar15,0x5d), lVar9 != -1)) ||
         ((lVar9 = std::__cxx11::string::find(cVar15,0x2f), lVar9 != -1 ||
          (lVar9 = std::__cxx11::string::find(cVar15,0x5c), lVar9 != -1)))) {
        piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1f8,
                   "feature name should not contain any of \'[ ] / \' characters. Parameter feature-namesvalue :"
                   ,"");
        std::operator+(local_1a8,&local_1f8,param_name);
        std::invalid_argument::invalid_argument(piVar10,(string *)local_1a8);
        __cxa_throw(piVar10,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)param_name);
      if (iVar5 == 0) {
        paVar1 = &local_1a8[0].field_2;
        pcVar2 = (param_value->_M_dataplus)._M_p;
        local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,pcVar2,pcVar2 + param_value->_M_string_length);
        boost::filesystem::detail::status((detail *)&local_1f8,(path *)local_1a8,(error_code *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_1a8[0]._M_dataplus._M_p);
        }
        if ((uint)local_1f8._M_dataplus._M_p < 2) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Primary key ",0xc);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,(param_value->_M_dataplus)._M_p,
                               param_value->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," not found.",0xb);
          std::endl<char,std::char_traits<char>>(poVar11);
          plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_1f8,"Primary key [",param_value);
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_1f8);
          local_1a8[0]._M_dataplus._M_p = (pointer)*plVar12;
          psVar13 = (size_type *)(plVar12 + 2);
          if ((size_type *)local_1a8[0]._M_dataplus._M_p == psVar13) {
            local_1a8[0].field_2._0_8_ = *psVar13;
            local_1a8[0].field_2._8_8_ = plVar12[3];
            local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_1a8[0].field_2._0_8_ = *psVar13;
          }
          local_1a8[0]._M_string_length = plVar12[1];
          *plVar12 = (long)psVar13;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          std::logic_error::logic_error(plVar7,(string *)local_1a8);
          __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        std::__cxx11::string::_M_assign((string *)&this->m_private_key);
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)param_name);
        if ((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)param_name), iVar5 != 0))
        {
          plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
          std::operator+(local_1a8,param_name," not recognized");
          std::logic_error::logic_error(plVar7,(string *)local_1a8);
          __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
      }
    }
  }
  return;
}

Assistant:

void License::add_parameter(const std::string &param_name, const std::string &param_value) {
	if (NO_OUTPUT_PARAM.find(param_name) == NO_OUTPUT_PARAM.end()) {
		if (param_name.find("date") != std::string::npos || param_name.find(PARAM_EXPIRY_DATE) != std::string::npos ||
			param_name.find(PARAM_BEGIN_DATE) != std::string::npos) {
			values_map[param_name] = normalize_date(param_value);
		} else if (param_name.find("version") != std::string::npos) {
			if (param_value != "0") {
				values_map[param_name] = param_value;
			}
		} else {
			values_map[param_name] = param_value;
		}
	} else if (PARAM_FEATURE_NAMES == param_name) {
		m_feature_names = param_value;
		if (m_feature_names.find('[') != std::string::npos || m_feature_names.find(']') != std::string::npos ||
			m_feature_names.find('/') != std::string::npos || m_feature_names.find('\\') != std::string::npos) {
			throw invalid_argument(
				string("feature name should not contain any of '[ ] / \' characters. Parameter " PARAM_FEATURE_NAMES
					   "value :") +
				param_name);
		}
	} else if (PARAM_PRIMARY_KEY == param_name) {
		if (!fs::exists(param_value)) {
			cerr << "Primary key " << param_value << " not found." << endl;
			throw logic_error("Primary key [" + param_value + "] not found");
		}
		m_private_key = param_value;
	} else if (PARAM_LICENSE_OUTPUT == param_name || PARAM_PROJECT_FOLDER == param_name) {
		// just ignore
	} else {
		throw logic_error(param_name + " not recognized");
	}
}